

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_parse_function_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateFieldBody
          (ParseFunctionGenerator *this,Formatter *format,WireType wiretype,FieldDescriptor *field)

{
  Options *pOVar1;
  ParseFunctionGenerator *this_00;
  byte bVar2;
  FieldDescriptor FVar3;
  Type TVar4;
  EnumDescriptor *this_01;
  LogMessage *other;
  AlphaNum *b;
  undefined1 *options;
  FieldDescriptor *field_00;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *pFVar5;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  long lVar6;
  char *pcVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  bool bVar9;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  string zigzag;
  string size;
  string type;
  uint32_t tag;
  SaveState formatter_state;
  allocator_type local_262;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_261;
  undefined1 local_260 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250 [2];
  undefined1 local_230 [48];
  ParseFunctionGenerator *local_200;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [32];
  string local_198;
  AlphaNum local_178;
  AlphaNum local_148;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  AlphaNum local_98;
  Formatter *local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_68 = format;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_60,&(format->vars_)._M_t);
  FieldName_abi_cxx11_((string *)local_260,(cpp *)field,field_00);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_118,(char (*) [5])0x3ea8a1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
  pOVar1 = this->options_;
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_178.piece_data_ = (char *)FieldDescriptor::TypeOnceInit;
    local_98.piece_data_ = (char *)field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_178,
               (FieldDescriptor **)&local_98);
  }
  PrimitiveTypeName_abi_cxx11_
            ((string *)&local_148,(cpp *)pOVar1,
             (Options *)
             (ulong)*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4),
             0x4344c0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[15],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_d8,(char (*) [15])"primitive_type",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_148);
  b = &local_178;
  __l._M_len = 2;
  __l._M_array = &local_118;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_230,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)b,
        (allocator_type *)&local_98);
  local_200 = this;
  Formatter::AddMap(format,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_230);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_230);
  lVar6 = -0x80;
  paVar8 = &local_d8.second.field_2;
  pFVar5 = extraout_RDX;
  do {
    if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*(undefined1 **)(paVar8->_M_local_buf + -0x10)) {
      operator_delete(*(undefined1 **)(paVar8->_M_local_buf + -0x10));
      pFVar5 = extraout_RDX_00;
    }
    if (paVar8->_M_local_buf + -0x20 != *(char **)(paVar8->_M_local_buf + -0x30)) {
      operator_delete(*(char **)(paVar8->_M_local_buf + -0x30));
      pFVar5 = extraout_RDX_01;
    }
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(paVar8->_M_local_buf + -0x40);
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0);
  if (local_148.piece_data_ != local_148.digits) {
    operator_delete(local_148.piece_data_);
    pFVar5 = extraout_RDX_02;
  }
  if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
    operator_delete((void *)local_260._0_8_);
    pFVar5 = extraout_RDX_03;
  }
  if ((~(byte)field[1] & 0x60) == 0) {
    local_260._0_8_ = "add_";
    local_260._8_8_ = (char *)0x4;
    FieldName_abi_cxx11_((string *)local_1b8,(cpp *)field,pFVar5);
    local_148.piece_data_ = (char *)local_1b8._0_8_;
    local_148.piece_size_ = local_1b8._8_8_;
    StrCat_abi_cxx11_(&local_198,(protobuf *)local_260,&local_148,b);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_118,(char (*) [10])"put_field",&local_198);
    local_178.piece_data_ = "add_";
    local_178.piece_size_ = 4;
    FieldName_abi_cxx11_(&local_1f8,(cpp *)field,field_01);
    local_98.piece_data_ = local_1f8._M_dataplus._M_p;
    local_98.piece_size_ = local_1f8._M_string_length;
    StrCat_abi_cxx11_(&local_1d8,(protobuf *)&local_178,&local_98,b);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_d8,(char (*) [14])"mutable_field",&local_1d8);
    __l_00._M_len = 2;
    __l_00._M_array = &local_118;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_230,__l_00,&local_261,&local_262);
    Formatter::AddMap(format,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_230);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_230);
    lVar6 = -0x80;
    paVar8 = &local_d8.second.field_2;
    do {
      if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*(undefined1 **)(paVar8->_M_local_buf + -0x10)) {
        operator_delete(*(undefined1 **)(paVar8->_M_local_buf + -0x10));
      }
      if (paVar8->_M_local_buf + -0x20 != *(char **)(paVar8->_M_local_buf + -0x30)) {
        operator_delete(*(char **)(paVar8->_M_local_buf + -0x30));
      }
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(paVar8->_M_local_buf + -0x40);
      lVar6 = lVar6 + 0x40;
    } while (lVar6 != 0);
  }
  else {
    local_260._0_8_ = "set_";
    local_260._8_8_ = (char *)0x4;
    FieldName_abi_cxx11_((string *)local_1b8,(cpp *)field,pFVar5);
    local_148.piece_data_ = (char *)local_1b8._0_8_;
    local_148.piece_size_ = local_1b8._8_8_;
    StrCat_abi_cxx11_(&local_198,(protobuf *)local_260,&local_148,b);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_118,(char (*) [10])"put_field",&local_198);
    local_178.piece_data_ = "mutable_";
    local_178.piece_size_ = 8;
    FieldName_abi_cxx11_(&local_1f8,(cpp *)field,field_02);
    local_98.piece_data_ = local_1f8._M_dataplus._M_p;
    local_98.piece_size_ = local_1f8._M_string_length;
    StrCat_abi_cxx11_(&local_1d8,(protobuf *)&local_178,&local_98,b);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_d8,(char (*) [14])"mutable_field",&local_1d8);
    __l_01._M_len = 2;
    __l_01._M_array = &local_118;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_230,__l_01,&local_261,&local_262);
    Formatter::AddMap(format,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_230);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_230);
    lVar6 = -0x80;
    paVar8 = &local_d8.second.field_2;
    do {
      if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*(undefined1 **)(paVar8->_M_local_buf + -0x10)) {
        operator_delete(*(undefined1 **)(paVar8->_M_local_buf + -0x10));
      }
      if (paVar8->_M_local_buf + -0x20 != *(char **)(paVar8->_M_local_buf + -0x30)) {
        operator_delete(*(char **)(paVar8->_M_local_buf + -0x30));
      }
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(paVar8->_M_local_buf + -0x40);
      lVar6 = lVar6 + 0x40;
    } while (lVar6 != 0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  this_00 = local_200;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  if ((FieldDescriptor *)local_1b8._0_8_ != (FieldDescriptor *)(local_1b8 + 0x10)) {
    operator_delete((void *)local_1b8._0_8_);
  }
  local_98.piece_data_ =
       (char *)CONCAT44(local_98.piece_data_._4_4_,*(int *)(field + 4) << 3 | wiretype);
  switch(wiretype) {
  case WIRETYPE_VARINT:
    pOVar1 = this_00->options_;
    pFVar5 = (FieldDescriptor *)(local_260 + 0x10);
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_230._0_8_ = FieldDescriptor::TypeOnceInit;
      local_260._0_8_ = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_230,
                 (FieldDescriptor **)local_260);
    }
    options = FieldDescriptor::kTypeToCppTypeMap;
    PrimitiveTypeName_abi_cxx11_
              (&local_118.first,(cpp *)pOVar1,
               (Options *)
               (ulong)*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4),
               0x4344c0);
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_230._0_8_ = FieldDescriptor::TypeOnceInit;
      local_260._0_8_ = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_230,
                 (FieldDescriptor **)local_260);
    }
    FVar3 = field[2];
    if (FVar3 == (FieldDescriptor)0xe) {
      local_230._0_8_ = local_230 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"enum_type","");
      this_01 = FieldDescriptor::enum_type(field);
      QualifiedClassName_abi_cxx11_
                ((string *)local_260,(cpp *)this_01,(EnumDescriptor *)this_00->options_,
                 (Options *)options);
      Formatter::Set<std::__cxx11::string>
                (format,(string *)local_230,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
      if ((FieldDescriptor *)local_260._0_8_ != pFVar5) {
        operator_delete((void *)local_260._0_8_);
      }
      if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
        operator_delete((void *)local_230._0_8_);
      }
      Formatter::operator()<>
                (format,"$uint64$ val = ::$proto_ns$::internal::ReadVarint64(&ptr);\nCHK_(ptr);\n");
      if (*(char *)(*(long *)(field + 0x10) + 0x3a) != '\x03') {
        Formatter::operator()<>(format,"if (PROTOBUF_PREDICT_TRUE($enum_type$_IsValid(val))) {\n");
        io::Printer::Indent(format->printer_);
      }
      Formatter::operator()<>(format,"$msg$_internal_$put_field$(static_cast<$enum_type$>(val));\n")
      ;
      if (*(char *)(*(long *)(field + 0x10) + 0x3a) != '\x03') {
        io::Printer::Outdent(format->printer_);
        local_230._0_4_ = *(undefined4 *)(field + 4);
        Formatter::operator()
                  (format,
                   "} else {\n  ::$proto_ns$::internal::WriteVarint($1$, val, $msg$mutable_unknown_fields());\n}\n"
                   ,(int *)local_230);
      }
    }
    else {
      if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
        local_260._0_8_ = FieldDescriptor::TypeOnceInit;
        local_148.piece_data_ = (char *)field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_260,
                   (FieldDescriptor **)&local_148);
        FVar3 = field[2];
      }
      pcVar7 = "32";
      if (FVar3 != (FieldDescriptor)0x5) {
        if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
          local_260._0_8_ = FieldDescriptor::TypeOnceInit;
          local_148.piece_data_ = (char *)field;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_260,
                     (FieldDescriptor **)&local_148);
          FVar3 = field[2];
        }
        if (FVar3 != (FieldDescriptor)0x11) {
          TVar4 = FieldDescriptor::type(field);
          pcVar7 = "64";
          if (TVar4 == TYPE_UINT32) {
            pcVar7 = "32";
          }
        }
      }
      local_230._0_8_ = local_230 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_230,pcVar7,pcVar7 + 2);
      local_260._8_8_ = (char *)0x0;
      local_250[0]._M_local_buf[0] = '\0';
      local_260._0_8_ = pFVar5;
      if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
        local_148.piece_data_ = (char *)FieldDescriptor::TypeOnceInit;
        local_178.piece_data_ = (char *)field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_148,
                   (FieldDescriptor **)&local_178);
      }
      FVar3 = field[2];
      if (FVar3 == (FieldDescriptor)0x11) {
LAB_002b6cc3:
        std::__cxx11::string::_M_replace((ulong)local_260,0,(char *)local_260._8_8_,0x3fa4e0);
      }
      else {
        if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
          local_148.piece_data_ = (char *)FieldDescriptor::TypeOnceInit;
          local_178.piece_data_ = (char *)field;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_148,
                     (FieldDescriptor **)&local_178);
          FVar3 = field[2];
        }
        if (FVar3 == (FieldDescriptor)0x12) goto LAB_002b6cc3;
      }
      pcVar7 = 
      "$msg$_internal_$put_field$(::$proto_ns$::internal::ReadVarint$1$$2$(&ptr));\nCHK_(ptr);\n";
      if (((~(byte)field[1] & 0x60) != 0) &&
         ((lVar6 = *(long *)(field + 0x28), lVar6 == 0 || ((byte)field[1] & 0x10) == 0 ||
          ((*(int *)(lVar6 + 4) == 1 && ((*(byte *)(*(long *)(lVar6 + 0x20) + 1) & 2) != 0)))))) {
        bVar9 = HasHasbit(field);
        pcVar7 = "$msg$$name$_ = ::$proto_ns$::internal::ReadVarint$1$$2$(&ptr);\nCHK_(ptr);\n";
        if (bVar9) {
          Formatter::operator()<>(format,"_Internal::set_has_$name$(&$has_bits$);\n");
        }
      }
      Formatter::operator()
                (format,pcVar7,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230);
      if ((FieldDescriptor *)local_260._0_8_ != pFVar5) {
        operator_delete((void *)local_260._0_8_);
      }
      if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
        operator_delete((void *)local_230._0_8_);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.first._M_dataplus._M_p != &local_118.first.field_2) {
      operator_delete(local_118.first._M_dataplus._M_p);
    }
    break;
  case WIRETYPE_FIXED64:
  case WIRETYPE_FIXED32:
    FVar3 = field[1];
    bVar2 = (byte)FVar3 & 0x60;
    pcVar7 = 
    "$msg$_internal_$put_field$(::$proto_ns$::internal::UnalignedLoad<$primitive_type$>(ptr));\nptr += sizeof($primitive_type$);\n"
    ;
    if (bVar2 != 0x60) {
      bVar9 = ((byte)FVar3 & 0x10) == 0;
      lVar6 = *(long *)(field + 0x28);
      if ((lVar6 == 0 || bVar9) ||
         ((*(int *)(lVar6 + 4) == 1 && ((*(byte *)(*(long *)(lVar6 + 0x20) + 1) & 2) != 0)))) {
        if (((byte)FVar3 & 2) == 0) {
          if ((bVar2 == 0x20) && (*(char *)(*(long *)(field + 0x10) + 0x3a) == '\x02')) {
            if (lVar6 == 0 || bVar9) goto LAB_002b6d3f;
          }
          else if (bVar2 == 0x40) goto LAB_002b6d3f;
          pcVar7 = 
          "$msg$$name$_ = ::$proto_ns$::internal::UnalignedLoad<$primitive_type$>(ptr);\nptr += sizeof($primitive_type$);\n"
          ;
        }
        else {
LAB_002b6d3f:
          pcVar7 = 
          "$msg$$name$_ = ::$proto_ns$::internal::UnalignedLoad<$primitive_type$>(ptr);\nptr += sizeof($primitive_type$);\n"
          ;
          if (*(char *)(*(long *)(field + 0x38) + 0x4f) == '\0') {
            Formatter::operator()<>(format,"_Internal::set_has_$name$(&$has_bits$);\n");
          }
        }
      }
    }
    goto LAB_002b6d5f;
  case WIRETYPE_LENGTH_DELIMITED:
    GenerateLengthDelim(this_00,format,field);
    pcVar7 = "CHK_(ptr);\n";
LAB_002b6d5f:
    Formatter::operator()<>(format,pcVar7);
    break;
  case WIRETYPE_START_GROUP:
    Formatter::operator()
              (format,
               "ptr = ctx->ParseGroup($msg$_internal_$mutable_field$(), ptr, $1$);\nCHK_(ptr);\n",
               (uint *)&local_98);
    break;
  case WIRETYPE_END_GROUP:
    internal::LogMessage::LogMessage
              ((LogMessage *)&local_118,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
               ,0x3ab);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)&local_118,"Can\'t have end group field\n");
    internal::LogFinisher::operator=((LogFinisher *)local_230,other);
    internal::LogMessage::~LogMessage((LogMessage *)&local_118);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::swap(&(local_68->vars_)._M_t,&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateFieldBody(
    Formatter& format, WireFormatLite::WireType wiretype,
    const FieldDescriptor* field) {
  Formatter::SaveState formatter_state(&format);
  format.AddMap(
      {{"name", FieldName(field)},
       {"primitive_type", PrimitiveTypeName(options_, field->cpp_type())}});
  if (field->is_repeated()) {
    format.AddMap({{"put_field", StrCat("add_", FieldName(field))},
                   {"mutable_field", StrCat("add_", FieldName(field))}});
  } else {
    format.AddMap(
        {{"put_field", StrCat("set_", FieldName(field))},
         {"mutable_field", StrCat("mutable_", FieldName(field))}});
  }
  uint32_t tag = WireFormatLite::MakeTag(field->number(), wiretype);
  switch (wiretype) {
    case WireFormatLite::WIRETYPE_VARINT: {
      std::string type = PrimitiveTypeName(options_, field->cpp_type());
      if (field->type() == FieldDescriptor::TYPE_ENUM) {
        format.Set("enum_type",
                   QualifiedClassName(field->enum_type(), options_));
        format(
            "$uint64$ val = ::$proto_ns$::internal::ReadVarint64(&ptr);\n"
            "CHK_(ptr);\n");
        if (!HasPreservingUnknownEnumSemantics(field)) {
          format("if (PROTOBUF_PREDICT_TRUE($enum_type$_IsValid(val))) {\n");
          format.Indent();
        }
        format("$msg$_internal_$put_field$(static_cast<$enum_type$>(val));\n");
        if (!HasPreservingUnknownEnumSemantics(field)) {
          format.Outdent();
          format(
              "} else {\n"
              "  ::$proto_ns$::internal::WriteVarint("
              "$1$, val, $msg$mutable_unknown_fields());\n"
              "}\n",
              field->number());
        }
      } else {
        std::string size = (field->type() == FieldDescriptor::TYPE_INT32 ||
                            field->type() == FieldDescriptor::TYPE_SINT32 ||
                            field->type() == FieldDescriptor::TYPE_UINT32)
                               ? "32"
                               : "64";
        std::string zigzag;
        if ((field->type() == FieldDescriptor::TYPE_SINT32 ||
             field->type() == FieldDescriptor::TYPE_SINT64)) {
          zigzag = "ZigZag";
        }
        if (field->is_repeated() || field->real_containing_oneof()) {
          format(
              "$msg$_internal_$put_field$("
              "::$proto_ns$::internal::ReadVarint$1$$2$(&ptr));\n"
              "CHK_(ptr);\n",
              zigzag, size);
        } else {
          if (HasHasbit(field)) {
            format("_Internal::set_has_$name$(&$has_bits$);\n");
          }
          format(
              "$msg$$name$_ = ::$proto_ns$::internal::ReadVarint$1$$2$(&ptr);\n"
              "CHK_(ptr);\n",
              zigzag, size);
        }
      }
      break;
    }
    case WireFormatLite::WIRETYPE_FIXED32:
    case WireFormatLite::WIRETYPE_FIXED64: {
      if (field->is_repeated() || field->real_containing_oneof()) {
        format(
            "$msg$_internal_$put_field$("
            "::$proto_ns$::internal::UnalignedLoad<$primitive_type$>(ptr));\n"
            "ptr += sizeof($primitive_type$);\n");
      } else {
        if (HasHasbit(field)) {
          format("_Internal::set_has_$name$(&$has_bits$);\n");
        }
        format(
            "$msg$$name$_ = "
            "::$proto_ns$::internal::UnalignedLoad<$primitive_type$>(ptr);\n"
            "ptr += sizeof($primitive_type$);\n");
      }
      break;
    }
    case WireFormatLite::WIRETYPE_LENGTH_DELIMITED: {
      GenerateLengthDelim(format, field);
      format("CHK_(ptr);\n");
      break;
    }
    case WireFormatLite::WIRETYPE_START_GROUP: {
      format(
          "ptr = ctx->ParseGroup($msg$_internal_$mutable_field$(), ptr, $1$);\n"
          "CHK_(ptr);\n",
          tag);
      break;
    }
    case WireFormatLite::WIRETYPE_END_GROUP: {
      GOOGLE_LOG(FATAL) << "Can't have end group field\n";
      break;
    }
  }  // switch (wire_type)
}